

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall
RoboClaw::GetPinFunctions(RoboClaw *this,uint8_t *S3mode,uint8_t *S4mode,uint8_t *S5mode)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  uint8_t *in_RCX;
  size_t __nbytes;
  uint8_t *puVar6;
  uint8_t *in_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_01;
  void *__buf_02;
  uint8_t *in_RSI;
  RoboClaw *in_RDI;
  bool bVar7;
  uint16_t ccrc;
  int16_t data;
  uint8_t trys;
  uint8_t val3;
  uint8_t val2;
  uint8_t val1;
  bool valid;
  uint8_t crc;
  ushort local_30;
  char local_2e;
  uint8_t local_2d;
  uint8_t local_2c;
  
  local_2e = '\x02';
  puVar6 = in_RCX;
  do {
    (*in_RDI->_vptr_RoboClaw[1])();
    crc_clear(in_RDI);
    __nbytes = CONCAT71((int7)((ulong)puVar6 >> 8),in_RDI->m_address);
    (**in_RDI->_vptr_RoboClaw)(in_RDI,(ulong)in_RDI->m_address);
    crc_update(in_RDI,in_RDI->m_address);
    (**in_RDI->_vptr_RoboClaw)(in_RDI,0x4b);
    crc_update(in_RDI,'K');
    sVar4 = read(in_RDI,in_RDI->m_timeout,__buf,__nbytes);
    local_30 = (ushort)sVar4 & 0xff;
    crc_update(in_RDI,(uint8_t)sVar4);
    __buf_01 = __buf_00;
    if (local_30 != 0xffff) {
      sVar5 = read(in_RDI,in_RDI->m_timeout,__buf_00,__nbytes);
      local_30 = (ushort)sVar5 & 0xff;
      local_2c = (uint8_t)sVar5;
      crc_update(in_RDI,local_2c);
      __buf_01 = extraout_RDX;
    }
    if (local_30 != 0xffff) {
      sVar5 = read(in_RDI,in_RDI->m_timeout,__buf_01,__nbytes);
      local_30 = (ushort)sVar5 & 0xff;
      local_2d = (uint8_t)sVar5;
      crc_update(in_RDI,local_2d);
      __buf_01 = extraout_RDX_00;
    }
    if (local_30 != 0xffff) {
      sVar5 = read(in_RDI,in_RDI->m_timeout,__buf_01,__nbytes);
      uVar1 = (ushort)sVar5 & 0xff;
      if (uVar1 != 0xffff) {
        sVar5 = read(in_RDI,in_RDI->m_timeout,__buf_02,__nbytes);
        uVar2 = (ushort)sVar5 & 0xff;
        if (uVar2 != 0xffff) {
          uVar2 = uVar1 << 8 | uVar2;
          uVar3 = crc_get(in_RDI);
          __nbytes = (size_t)uVar2;
          if (uVar3 == uVar2) {
            *in_RSI = (uint8_t)sVar4;
            *in_RDX = local_2c;
            *in_RCX = local_2d;
            return true;
          }
        }
      }
    }
    puVar6 = (uint8_t *)CONCAT71((int7)(__nbytes >> 8),local_2e + -1);
    bVar7 = local_2e != '\0';
    local_2e = local_2e + -1;
  } while (bVar7);
  return false;
}

Assistant:

bool RoboClaw::GetPinFunctions( uint8_t &S3mode, uint8_t &S4mode, uint8_t &S5mode)
{
    uint8_t crc;
    bool valid = false;
    uint8_t val1,val2,val3;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( m_address);
        crc_update( m_address );
        write(GETPINFUNCTIONS);
        crc_update(GETPINFUNCTIONS);

        data = read( m_timeout );
        crc_update(data);
        val1=data;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            val2=data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            val3=data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        S3mode = val1;
                        S4mode = val2;
                        S5mode = val3;
                        return true;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}